

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::OurReader::readNumber(OurReader *this,bool checkInf)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  bool bVar4;
  
  pbVar1 = (byte *)this->end_;
  pbVar2 = (byte *)this->current_;
  if ((checkInf && pbVar2 != pbVar1) && (*pbVar2 == 0x49)) {
    this->current_ = (Location)(pbVar2 + 1);
    return false;
  }
  do {
    this->current_ = (Location)pbVar2;
    if (pbVar2 < pbVar1) {
      bVar3 = *pbVar2;
      pbVar2 = pbVar2 + 1;
    }
    else {
      bVar3 = 0;
    }
  } while ((byte)(bVar3 - 0x30) < 10);
  if (bVar3 == 0x2e) {
    this->current_ = (Location)pbVar2;
    if (pbVar2 < pbVar1) {
      bVar3 = *pbVar2;
      pbVar2 = pbVar2 + 1;
    }
    else {
      bVar3 = 0;
    }
    while ((byte)(bVar3 - 0x30) < 10) {
      this->current_ = (Location)pbVar2;
      if (pbVar2 < pbVar1) {
        bVar3 = *pbVar2;
        pbVar2 = pbVar2 + 1;
      }
      else {
        bVar3 = 0;
      }
    }
  }
  if ((bVar3 & 0xdf) == 0x45) {
    this->current_ = (Location)pbVar2;
    if (pbVar2 < pbVar1) {
      bVar3 = *pbVar2;
      pbVar2 = pbVar2 + 1;
    }
    else {
      bVar3 = 0;
    }
    if ((bVar3 == 0x2d) || (bVar3 == 0x2b)) {
      this->current_ = (Location)pbVar2;
      if (pbVar2 < pbVar1) {
        bVar3 = *pbVar2;
        pbVar2 = pbVar2 + 1;
      }
      else {
        bVar3 = 0;
      }
    }
    if ((byte)(bVar3 - 0x30) < 10) {
      do {
        this->current_ = (Location)pbVar2;
        if (pbVar2 < pbVar1) {
          bVar3 = *pbVar2;
          pbVar2 = pbVar2 + 1;
          bVar4 = (byte)(bVar3 - 0x30) < 10;
        }
        else {
          bVar4 = false;
        }
      } while (bVar4);
    }
  }
  return true;
}

Assistant:

bool OurReader::readNumber(bool checkInf) {
  Location p = current_;
  if (checkInf && p != end_ && *p == 'I') {
    current_ = ++p;
    return false;
  }
  char c = '0'; // stopgap for already consumed character
  // integral part
  while (c >= '0' && c <= '9')
    c = (current_ = p) < end_ ? *p++ : '\0';
  // fractional part
  if (c == '.') {
    c = (current_ = p) < end_ ? *p++ : '\0';
    while (c >= '0' && c <= '9')
      c = (current_ = p) < end_ ? *p++ : '\0';
  }
  // exponential part
  if (c == 'e' || c == 'E') {
    c = (current_ = p) < end_ ? *p++ : '\0';
    if (c == '+' || c == '-')
      c = (current_ = p) < end_ ? *p++ : '\0';
    while (c >= '0' && c <= '9')
      c = (current_ = p) < end_ ? *p++ : '\0';
  }
  return true;
}